

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O1

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CAssignSubscriptStm *statement)

{
  CIdExp *pCVar1;
  IExpression *pIVar2;
  ISubtreeWrapper *pIVar3;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> _Var4;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> _Var5;
  CMemExpression *pCVar6;
  CMoveStatement *this_00;
  int _value;
  ISubtreeWrapper *pIVar7;
  CBinopExpression *this_01;
  CBinopExpression *pCVar8;
  CConstExpression *pCVar9;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_a0;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_98;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_90;
  CExpression *local_88;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_80;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_78;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_70;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_68;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_60;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_58;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_50;
  CMemExpression *local_48;
  CBinopExpression *local_40;
  CMoveStatement *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"IRT builder: CAssignSubscriptStm\n",0x21);
  pCVar1 = (statement->idExpression)._M_t.
           super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar1->super_IExpression).super_PositionedNode)(pCVar1,this);
  (**((this->wrapper)._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)->_vptr_ISubtreeWrapper)
            (&local_58);
  _Var4._M_head_impl = local_58._M_head_impl;
  pIVar2 = (statement->indexExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  (**((this->wrapper)._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)->_vptr_ISubtreeWrapper)
            (&local_58);
  _Var5._M_head_impl = local_58._M_head_impl;
  pIVar2 = (statement->valueExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  (**((this->wrapper)._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)->_vptr_ISubtreeWrapper)
            (&local_58);
  local_88 = local_58._M_head_impl;
  pIVar7 = (ISubtreeWrapper *)operator_new(0x10);
  local_38 = (CMoveStatement *)operator_new(0x18);
  local_48 = (CMemExpression *)operator_new(0x10);
  local_40 = (CBinopExpression *)operator_new(0x20);
  local_90._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
        )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )_Var4._M_head_impl;
  this_01 = (CBinopExpression *)operator_new(0x20);
  pCVar8 = (CBinopExpression *)operator_new(0x20);
  local_a0._M_head_impl = _Var5._M_head_impl;
  pCVar9 = (CConstExpression *)operator_new(0x10);
  IRT::CConstExpression::CConstExpression(pCVar9,1);
  local_70._M_head_impl = (CExpression *)pCVar9;
  IRT::CBinopExpression::CBinopExpression
            (pCVar8,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                     *)&local_a0,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_70,PLUS);
  local_98._M_head_impl = (CExpression *)pCVar8;
  pCVar9 = (CConstExpression *)operator_new(0x10);
  _value = IRT::CFrame::GetWordSize(this->currentFrame);
  IRT::CConstExpression::CConstExpression(pCVar9,_value);
  local_78._M_head_impl = (CExpression *)pCVar9;
  IRT::CBinopExpression::CBinopExpression
            (this_01,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                      *)&local_98,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_78,MULTYPLY);
  this_00 = local_38;
  pCVar8 = local_40;
  local_68._M_head_impl = (CExpression *)this_01;
  IRT::CBinopExpression::CBinopExpression
            (local_40,&local_90,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_68,PLUS);
  pCVar6 = local_48;
  local_60._M_head_impl = &pCVar8->super_CExpression;
  IRT::CMemExpression::CMemExpression
            (local_48,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_60);
  local_50._M_head_impl = &pCVar6->super_CExpression;
  local_80._M_head_impl = local_88;
  IRT::CMoveStatement::CMoveStatement
            (this_00,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                      *)&local_50,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_80);
  pIVar7->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_001834e0;
  pIVar7[1]._vptr_ISubtreeWrapper = (_func_int **)this_00;
  pIVar3 = (this->wrapper)._M_t.
           super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
           _M_t.
           super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
           .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = pIVar7;
  if (pIVar3 != (ISubtreeWrapper *)0x0) {
    operator_delete(pIVar3);
  }
  if (local_80._M_head_impl != (CExpression *)0x0) {
    (*((local_80._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  local_80._M_head_impl = (CExpression *)0x0;
  if ((CMemExpression *)local_50._M_head_impl != (CMemExpression *)0x0) {
    (*(((CExpression *)&(local_50._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_50._M_head_impl = (CExpression *)0x0;
  if ((CBinopExpression *)local_60._M_head_impl != (CBinopExpression *)0x0) {
    (*(((CExpression *)&(local_60._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_60._M_head_impl = (CExpression *)0x0;
  if ((CBinopExpression *)local_68._M_head_impl != (CBinopExpression *)0x0) {
    (*(((CExpression *)&(local_68._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_68._M_head_impl = (CExpression *)0x0;
  if ((CConstExpression *)local_78._M_head_impl != (CConstExpression *)0x0) {
    (*(((CExpression *)&(local_78._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_78._M_head_impl = (CExpression *)0x0;
  if ((CBinopExpression *)local_98._M_head_impl != (CBinopExpression *)0x0) {
    (*(((CExpression *)&(local_98._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_98._M_head_impl = (CExpression *)0x0;
  if ((CConstExpression *)local_70._M_head_impl != (CConstExpression *)0x0) {
    (*(((CExpression *)&(local_70._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_70._M_head_impl = (CExpression *)0x0;
  if (local_a0._M_head_impl != (CExpression *)0x0) {
    (*((local_a0._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  local_a0._M_head_impl = (CExpression *)0x0;
  if (local_90._M_t.
      super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
      _M_t.
      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>)0x0) {
    (**(code **)((long)*(IExpression *)
                        local_90._M_t.
                        super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                        .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl + 0x10)
    )();
  }
  return;
}

Assistant:

void CBuildVisitor::Visit( CAssignSubscriptStm &statement ) {
    std::cout << "IRT builder: CAssignSubscriptStm\n";
    statement.idExpression->Accept( *this );
    std::unique_ptr<const IRT::CExpression> leftPartExpression = std::move( wrapper->ToExpression( ));

    statement.indexExpression->Accept(*this);
    std::unique_ptr<const IRT::CExpression> indexExpression = std::move( wrapper->ToExpression() );

    statement.valueExpression->Accept( *this );
    std::unique_ptr<const IRT::CExpression> rightPartExpression = std::move( wrapper->ToExpression( ));


    updateSubtreeWrapper( new IRT::CStatementWrapper(
            new IRT::CMoveStatement(
                    std::move( std::unique_ptr<const IRT::CExpression>(
                            new IRT::CMemExpression(
                                    std::move( std::unique_ptr<const IRT::CExpression>( new IRT::CBinopExpression(
                                            std::move( leftPartExpression ),
                                            std::move( std::unique_ptr<const IRT::CExpression>(
                                                    new IRT::CBinopExpression(
                                                            std::move( std::unique_ptr<const IRT::CExpression>(
                                                                    new IRT::CBinopExpression(
                                                                            std::move( indexExpression ),
                                                                            std::move(
                                                                                    std::unique_ptr<const IRT::CExpression>(
                                                                                            new IRT::CConstExpression(
                                                                                                    1 )
                                                                                    )),
                                                                            IRT::enums::TOperationType::PLUS
                                                                    ))),
                                                            std::move( std::unique_ptr<const IRT::CExpression>(
                                                                    new IRT::CConstExpression(
                                                                            currentFrame->GetWordSize( )))),
                                                            IRT::enums::TOperationType::MULTYPLY
                                                    )
                                            )),
                                            IRT::enums::TOperationType::PLUS
                                                                                        )
                                               )
                                    )))),
                    std::move( rightPartExpression )
            )
    ));

}